

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::InternReadFile
          (SMDImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  undefined1 auVar1 [16];
  bool bVar2;
  DeadlyImportError *this_00;
  long lVar3;
  Logger *this_01;
  ulong uVar4;
  void *pvVar5;
  undefined1 local_d0 [8];
  SkeletonMeshBuilder skeleton;
  iterator iStack_78;
  uint i_1;
  __normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
  local_70;
  __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
  local_68;
  const_iterator i;
  allocator<char> local_49;
  string local_48;
  IOSystem *local_28;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  SMDImporter *this_local;
  
  this->pScene = pScene;
  local_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)pFile;
  pFile_local = (string *)this;
  ReadSmd(this,pFile,pIOHandler);
  bVar2 = std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::empty
                    (&this->asTriangles);
  if (bVar2) {
    bVar2 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::empty
                      (&this->asBones);
    if (bVar2) {
      i._M_current._3_1_ = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,
                 "SMD: No triangles and no bones have been found in the file. This file seems to be invalid."
                 ,&local_49);
      DeadlyImportError::DeadlyImportError(this_00,&local_48);
      i._M_current._3_1_ = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    *(uint *)&pIOHandler_local->_vptr_IOSystem = *(uint *)&pIOHandler_local->_vptr_IOSystem | 1;
  }
  bVar2 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::empty(&this->asBones);
  if (!bVar2) {
    local_70._M_current =
         (Bone *)std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::begin
                           (&this->asBones);
    __gnu_cxx::
    __normal_iterator<Assimp::SMD::Bone_const*,std::vector<Assimp::SMD::Bone,std::allocator<Assimp::SMD::Bone>>>
    ::__normal_iterator<Assimp::SMD::Bone*>
              ((__normal_iterator<Assimp::SMD::Bone_const*,std::vector<Assimp::SMD::Bone,std::allocator<Assimp::SMD::Bone>>>
                *)&local_68,&local_70);
    while( true ) {
      iStack_78 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::end
                            (&this->asBones);
      bVar2 = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff88);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
      ::operator*(&local_68);
      lVar3 = std::__cxx11::string::length();
      if (lVar3 == 0) {
        this_01 = DefaultLogger::get();
        Logger::warn(this_01,"SMD: Not all bones have been initialized");
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
      ::operator++(&local_68);
    }
    FixTimeValues(this);
  }
  CreateOutputNodes(this);
  if (((ulong)pIOHandler_local->_vptr_IOSystem & 1) == 0) {
    CreateOutputMeshes(this);
    CreateOutputMaterials(this);
    *(undefined4 *)
     ((pIOHandler_local->m_pathStack).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x23) =
         *(undefined4 *)
          &(pIOHandler_local->m_pathStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    auVar1 = ZEXT416(*(uint *)&(pIOHandler_local->m_pathStack).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish) * ZEXT816(4);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    (pIOHandler_local->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[0x23]._M_string_length = (size_type)pvVar5;
    for (skeleton._76_4_ = 0;
        (uint)skeleton._76_4_ <
        *(uint *)&(pIOHandler_local->m_pathStack).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; skeleton._76_4_ = skeleton._76_4_ + 1)
    {
      *(undefined4 *)
       ((pIOHandler_local->m_pathStack).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[0x23]._M_string_length +
       (ulong)(uint)skeleton._76_4_ * 4) = skeleton._76_4_;
    }
  }
  CreateOutputAnimations(this,(string *)pScene_local,local_28);
  if ((((ulong)pIOHandler_local->_vptr_IOSystem & 1) != 0) && ((this->noSkeletonMesh & 1U) == 0)) {
    SkeletonMeshBuilder::SkeletonMeshBuilder
              ((SkeletonMeshBuilder *)local_d0,(aiScene *)pIOHandler_local,(aiNode *)0x0,false);
    SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)local_d0);
  }
  return;
}

Assistant:

void SMDImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    this->pScene = pScene;
    ReadSmd(pFile, pIOHandler);

    // If there are no triangles it seems to be an animation SMD,
    // containing only the animation skeleton.
    if (asTriangles.empty()) {
        if (asBones.empty()) {
            throw DeadlyImportError("SMD: No triangles and no bones have "
                "been found in the file. This file seems to be invalid.");
        }

        // Set the flag in the scene structure which indicates
        // that there is nothing than an animation skeleton
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    if (!asBones.empty()) {
        // Check whether all bones have been initialized
        for (std::vector<SMD::Bone>::const_iterator
                i =  asBones.begin();
                i != asBones.end();++i) {
            if (!(*i).mName.length()) {
                ASSIMP_LOG_WARN("SMD: Not all bones have been initialized");
                break;
            }
        }

        // now fix invalid time values and make sure the animation starts at frame 0
        FixTimeValues();
    }

    // build output nodes (bones are added as empty dummy nodes)
    CreateOutputNodes();

    if (!(pScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE)) {
        // create output meshes
        CreateOutputMeshes();

        // build an output material list
        CreateOutputMaterials();

        // use root node that renders all meshes
        pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
        pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            pScene->mRootNode->mMeshes[i] = i;
        }
    }

    // build the output animation
    CreateOutputAnimations(pFile, pIOHandler);

    if ((pScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE) && !noSkeletonMesh) {
        SkeletonMeshBuilder skeleton(pScene);
    }
}